

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O0

void PrintSarrBytes(Sarray *A)

{
  ulong uVar1;
  _Setfill<char> _Var2;
  bool bVar3;
  _Setw _Var4;
  reference this;
  reference pvVar5;
  ostream *poVar6;
  int x_1;
  uint64_t a;
  int i;
  int x;
  int y;
  bool b;
  Sarray *A_local;
  
  bVar3 = true;
  for (i = 0; i < 5; i = i + 1) {
    for (a._4_4_ = 0; a._4_4_ < 5; a._4_4_ = a._4_4_ + 1) {
      for (a._0_4_ = 0; (int)a < 8; a._0_4_ = (int)a + 1) {
        this = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](A,(long)a._4_4_);
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (this,(long)i);
        uVar1 = *pvVar5;
        _Var4 = std::setw(2);
        poVar6 = std::operator<<((ostream *)&std::cout,_Var4);
        _Var2 = std::setfill<char>('0');
        poVar6 = std::operator<<(poVar6,_Var2._M_c);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::hex);
        std::ostream::operator<<(poVar6,(uint)(uVar1 >> ((byte)((int)a << 3) & 0x3f)) & 0xff);
      }
      if (bVar3) {
        std::operator<<((ostream *)&std::cout,' ');
      }
      else {
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      }
      bVar3 = (bool)(bVar3 ^ 1);
    }
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintSarrBytes(Sarray A){
    bool b = true;
    for(int y = 0; y < 5; y++){
        for(int x = 0; x < 5; x++){
            for(int i = 0; i < 8; i ++){
                uint64_t a = A[x][y] >> (8*i);
                int x = a&255;
                cout <<  setw(2) << setfill('0') << hex << x;
            }
            if(b){cout << ' ';}
            else{ cout << endl;}
            b = !b;
        }

    }
    cout << endl;
}